

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

float64 vector_sum_norm(float32 *vec,int32 len)

{
  int local_2c;
  int32 i;
  float64 f;
  float64 sum;
  int32 len_local;
  float32 *vec_local;
  
  f = 0.0;
  for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
    f = (float64)((double)(float)vec[local_2c] + (double)f);
  }
  if (((double)f != 0.0) || (NAN((double)f))) {
    for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
      vec[local_2c] = (float32)(float)((double)(float)vec[local_2c] * (1.0 / (double)f));
    }
  }
  return f;
}

Assistant:

float64
vector_sum_norm(float32 * vec, int32 len)
{
    float64 sum, f;
    int32 i;

    sum = 0.0;
    for (i = 0; i < len; i++)
        sum += vec[i];

    if (sum != 0.0) {
        f = 1.0 / sum;
        for (i = 0; i < len; i++)
            vec[i] *= f;
    }

    return sum;
}